

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_impl.h
# Opt level: O1

int secp256k1_ellswift_decode(secp256k1_context *ctx,secp256k1_pubkey *pubkey,uchar *ell64)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  ulong uVar60;
  ulong uVar61;
  secp256k1_fe t;
  secp256k1_fe u;
  secp256k1_fe xd;
  secp256k1_ge p;
  secp256k1_fe local_128;
  secp256k1_fe local_100;
  secp256k1_fe local_d8;
  secp256k1_fe local_b0;
  secp256k1_ge local_88;
  
  if (pubkey == (secp256k1_pubkey *)0x0) {
    secp256k1_ellswift_decode_cold_2();
  }
  else {
    if (ell64 != (uchar *)0x0) {
      secp256k1_fe_impl_set_b32_mod(&local_100,ell64);
      secp256k1_fe_impl_set_b32_mod(&local_128,ell64 + 0x20);
      secp256k1_fe_impl_normalize_var(&local_128);
      secp256k1_ellswift_xswiftec_frac_var(&local_88.x,&local_b0,&local_100,&local_128);
      secp256k1_fe_impl_inv_var(&local_b0,&local_b0);
      auVar1._8_8_ = 0;
      auVar1._0_8_ = local_b0.n[3];
      auVar32._8_8_ = 0;
      auVar32._0_8_ = local_88.x.n[0];
      auVar2._8_8_ = 0;
      auVar2._0_8_ = local_b0.n[2];
      auVar33._8_8_ = 0;
      auVar33._0_8_ = local_88.x.n[1];
      auVar3._8_8_ = 0;
      auVar3._0_8_ = local_b0.n[1];
      auVar34._8_8_ = 0;
      auVar34._0_8_ = local_88.x.n[2];
      auVar4._8_8_ = 0;
      auVar4._0_8_ = local_b0.n[0];
      auVar35._8_8_ = 0;
      auVar35._0_8_ = local_88.x.n[3];
      auVar5._8_8_ = 0;
      auVar5._0_8_ = local_b0.n[4];
      auVar36._8_8_ = 0;
      auVar36._0_8_ = local_88.x.n[4];
      auVar6._8_8_ = 0;
      auVar6._0_8_ = SUB168(auVar5 * auVar36,0);
      auVar1 = auVar2 * auVar33 + auVar1 * auVar32 + auVar3 * auVar34 + auVar4 * auVar35 +
               auVar6 * ZEXT816(0x1000003d10);
      auVar7._8_8_ = 0;
      auVar7._0_8_ = local_b0.n[4];
      auVar37._8_8_ = 0;
      auVar37._0_8_ = local_88.x.n[0];
      auVar8._8_8_ = 0;
      auVar8._0_8_ = local_b0.n[3];
      auVar38._8_8_ = 0;
      auVar38._0_8_ = local_88.x.n[1];
      auVar9._8_8_ = 0;
      auVar9._0_8_ = local_b0.n[2];
      auVar39._8_8_ = 0;
      auVar39._0_8_ = local_88.x.n[2];
      auVar10._8_8_ = 0;
      auVar10._0_8_ = local_b0.n[1];
      auVar40._8_8_ = 0;
      auVar40._0_8_ = local_88.x.n[3];
      auVar11._8_8_ = 0;
      auVar11._0_8_ = local_b0.n[0];
      auVar41._8_8_ = 0;
      auVar41._0_8_ = local_88.x.n[4];
      auVar12._8_8_ = 0;
      auVar12._0_8_ = SUB168(auVar5 * auVar36,8);
      auVar2 = auVar12 * ZEXT816(0x1000003d10000) +
               auVar11 * auVar41 + auVar10 * auVar40 + auVar9 * auVar39 + auVar8 * auVar38 +
               auVar7 * auVar37 + (auVar1 >> 0x34);
      auVar13._8_8_ = 0;
      auVar13._0_8_ = local_b0.n[0];
      auVar42._8_8_ = 0;
      auVar42._0_8_ = local_88.x.n[0];
      auVar14._8_8_ = 0;
      auVar14._0_8_ = local_b0.n[4];
      auVar43._8_8_ = 0;
      auVar43._0_8_ = local_88.x.n[1];
      auVar15._8_8_ = 0;
      auVar15._0_8_ = local_b0.n[3];
      auVar44._8_8_ = 0;
      auVar44._0_8_ = local_88.x.n[2];
      auVar16._8_8_ = 0;
      auVar16._0_8_ = local_b0.n[2];
      auVar45._8_8_ = 0;
      auVar45._0_8_ = local_88.x.n[3];
      auVar17._8_8_ = 0;
      auVar17._0_8_ = local_b0.n[1];
      auVar46._8_8_ = 0;
      auVar46._0_8_ = local_88.x.n[4];
      auVar3 = auVar17 * auVar46 + auVar16 * auVar45 + auVar15 * auVar44 + auVar14 * auVar43 +
               (auVar2 >> 0x34);
      auVar18._8_8_ = 0;
      auVar18._0_8_ = (auVar3._0_8_ & 0xfffffffffffff) << 4 | (ulong)(auVar2._6_2_ & 0xf);
      auVar4 = auVar18 * ZEXT816(0x1000003d1) + auVar13 * auVar42;
      uVar60 = auVar4._0_8_;
      uVar61 = auVar4._8_8_;
      local_d8.n[0] = uVar60 & 0xfffffffffffff;
      auVar19._8_8_ = 0;
      auVar19._0_8_ = local_b0.n[1];
      auVar47._8_8_ = 0;
      auVar47._0_8_ = local_88.x.n[0];
      auVar20._8_8_ = 0;
      auVar20._0_8_ = local_b0.n[0];
      auVar48._8_8_ = 0;
      auVar48._0_8_ = local_88.x.n[1];
      auVar21._8_8_ = 0;
      auVar21._0_8_ = local_b0.n[4];
      auVar49._8_8_ = 0;
      auVar49._0_8_ = local_88.x.n[2];
      auVar57._8_8_ = uVar61 >> 0x34;
      auVar57._0_8_ = uVar61 * 0x1000 | uVar60 >> 0x34;
      auVar22._8_8_ = 0;
      auVar22._0_8_ = local_b0.n[3];
      auVar50._8_8_ = 0;
      auVar50._0_8_ = local_88.x.n[3];
      auVar23._8_8_ = 0;
      auVar23._0_8_ = local_b0.n[2];
      auVar51._8_8_ = 0;
      auVar51._0_8_ = local_88.x.n[4];
      auVar3 = auVar21 * auVar49 + auVar23 * auVar51 + auVar22 * auVar50 + (auVar3 >> 0x34);
      auVar24._8_8_ = 0;
      auVar24._0_8_ = auVar3._0_8_ & 0xfffffffffffff;
      auVar57 = auVar24 * ZEXT816(0x1000003d10) + auVar20 * auVar48 + auVar19 * auVar47 + auVar57;
      local_d8.n[1] = auVar57._0_8_ & 0xfffffffffffff;
      auVar25._8_8_ = 0;
      auVar25._0_8_ = local_b0.n[2];
      auVar52._8_8_ = 0;
      auVar52._0_8_ = local_88.x.n[0];
      auVar26._8_8_ = 0;
      auVar26._0_8_ = local_b0.n[1];
      auVar53._8_8_ = 0;
      auVar53._0_8_ = local_88.x.n[1];
      auVar27._8_8_ = 0;
      auVar27._0_8_ = local_b0.n[0];
      auVar54._8_8_ = 0;
      auVar54._0_8_ = local_88.x.n[2];
      auVar28._8_8_ = 0;
      auVar28._0_8_ = local_b0.n[4];
      auVar55._8_8_ = 0;
      auVar55._0_8_ = local_88.x.n[3];
      auVar29._8_8_ = 0;
      auVar29._0_8_ = local_b0.n[3];
      auVar56._8_8_ = 0;
      auVar56._0_8_ = local_88.x.n[4];
      auVar3 = auVar29 * auVar56 + auVar28 * auVar55 + (auVar3 >> 0x34);
      auVar30._8_8_ = 0;
      auVar30._0_8_ = auVar3._0_8_;
      auVar4 = auVar30 * ZEXT816(0x1000003d10) +
               auVar27 * auVar54 + auVar25 * auVar52 + auVar26 * auVar53 + (auVar57 >> 0x34);
      auVar5 = auVar4 >> 0x34;
      auVar59._8_8_ = 0;
      auVar59._0_8_ = auVar5._0_8_;
      local_d8.n[2] = auVar4._0_8_ & 0xfffffffffffff;
      auVar31._8_8_ = 0;
      auVar31._0_8_ = auVar3._8_8_;
      auVar58._8_8_ = auVar5._8_8_;
      auVar58._0_8_ = auVar1._0_8_ & 0xfffffffffffff;
      auVar59 = auVar31 * ZEXT816(0x1000003d10000) + auVar58 + auVar59;
      uVar60 = auVar59._0_8_;
      local_d8.n[3] = uVar60 & 0xfffffffffffff;
      local_d8.n[4] = (auVar59._8_8_ << 0xc | uVar60 >> 0x34) + (auVar2._0_8_ & 0xffffffffffff);
      secp256k1_ge_set_xo_var(&local_88,&local_d8,(uint)local_128.n[0] & 1);
      secp256k1_pubkey_save(pubkey,&local_88);
      return 1;
    }
    secp256k1_ellswift_decode_cold_1();
  }
  return 0;
}

Assistant:

int secp256k1_ellswift_decode(const secp256k1_context *ctx, secp256k1_pubkey *pubkey, const unsigned char *ell64) {
    secp256k1_fe u, t;
    secp256k1_ge p;
    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(pubkey != NULL);
    ARG_CHECK(ell64 != NULL);

    secp256k1_fe_set_b32_mod(&u, ell64);
    secp256k1_fe_set_b32_mod(&t, ell64 + 32);
    secp256k1_fe_normalize_var(&t);
    secp256k1_ellswift_swiftec_var(&p, &u, &t);
    secp256k1_pubkey_save(pubkey, &p);
    return 1;
}